

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<ki::protocol::dml::MessageModule> * __thiscall
pybind11::class_<ki::protocol::dml::MessageModule>::
def<ki::protocol::dml::MessageTemplate_const*(ki::protocol::dml::MessageModule::*)(std::__cxx11::string,ki::dml::Record*,bool),pybind11::return_value_policy>
          (class_<ki::protocol::dml::MessageModule> *this,char *name_,offset_in_Message_to_subr *f,
          return_value_policy *extra)

{
  offset_in_Message_to_subr f_00;
  name *extra_00;
  cpp_function cf;
  handle local_70;
  handle local_68;
  handle local_60;
  handle local_58;
  object local_50;
  is_method local_48;
  handle local_40;
  handle local_38;
  object local_30;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_58.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_48.class_.m_ptr = (handle)(handle)name_;
  local_70.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_70.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_70.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_68.m_ptr = local_70.m_ptr;
  cpp_function::
  cpp_function<ki::protocol::dml::MessageTemplate_const*,ki::protocol::dml::MessageModule,std::__cxx11::string,ki::dml::Record*,bool,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>
            ((cpp_function *)&local_60,f_00,extra_00,&local_48,(sibling *)&local_58,
             (return_value_policy *)&local_68);
  object::~object((object *)&local_70);
  object::~object(&local_50);
  cpp_function::name((cpp_function *)&local_68);
  local_40.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  if (local_68.m_ptr != (PyObject *)0x0) {
    (local_68.m_ptr)->ob_refcnt = (local_68.m_ptr)->ob_refcnt + 1;
  }
  local_38.m_ptr = local_68.m_ptr;
  local_58.m_ptr = (PyObject *)0x0;
  local_30.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object((object *)&local_58);
  detail::accessor_policies::obj_attr::set(local_40,local_38,local_60);
  object::~object(&local_30);
  object::~object((object *)&local_38);
  object::~object((object *)&local_68);
  object::~object((object *)&local_60);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }